

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png_io.cc
# Opt level: O2

bool __thiscall gimage::PNGImageIO::handlesFile(PNGImageIO *this,char *name,bool reading)

{
  long lVar1;
  bool bVar2;
  allocator local_29;
  string s;
  
  std::__cxx11::string::string((string *)&s,name,&local_29);
  if (s._M_string_length < 5) {
    bVar2 = false;
  }
  else {
    lVar1 = std::__cxx11::string::rfind((char *)&s,0x14f560);
    bVar2 = true;
    if (lVar1 != s._M_string_length - 4) {
      lVar1 = std::__cxx11::string::rfind((char *)&s,0x14fe05);
      bVar2 = lVar1 == s._M_string_length - 4;
    }
  }
  std::__cxx11::string::~string((string *)&s);
  return bVar2;
}

Assistant:

bool PNGImageIO::handlesFile(const char *name, bool reading) const
{
  std::string s=name;

  if (s.size() <= 4)
  {
    return false;
  }

  if (s.rfind(".png") == s.size()-4 || s.rfind(".PNG") == s.size()-4)
  {
    return true;
  }

  return false;
}